

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::ArrayInputStream::BackUp(ArrayInputStream *this,int count)

{
  int iVar1;
  Nonnull<const_char_*> failure_msg;
  LogMessage LStack_18;
  
  iVar1 = this->last_returned_size_;
  if ((long)iVar1 < 1) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar1,0,"last_returned_size_ > 0");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x47,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [55])"BackUp() can only be called after a successful Next().");
  }
  else {
    if (iVar1 < count) {
      BackUp();
    }
    else if (-1 < count) {
      this->position_ = this->position_ - count;
      this->last_returned_size_ = 0;
      return;
    }
    BackUp();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

void ArrayInputStream::BackUp(int count) {
  ABSL_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  ABSL_CHECK_LE(count, last_returned_size_);
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}